

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

float16 float16_sqrt_mips64(float16 a,float_status *status)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  float16 fVar4;
  uint64_t uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  FloatParts a_00;
  
  a_00 = float16a_unpack_canonical(a,status,&float16_params);
  if (((undefined1  [16])a_00 & (undefined1  [16])0xfc00000000) == (undefined1  [16])0x0) {
    uVar7 = a_00._12_4_ & 3;
    if (uVar7 != 1) {
      if ((a_00._8_8_ >> 0x28 & 1) == 0) {
        if (uVar7 == 2) {
          uVar6 = a_00.frac >> (~(byte)a_00.exp & 1);
          uVar8 = 0x3e;
          lVar9 = 0;
          lVar10 = 0;
          do {
            uVar8 = uVar8 - 1;
            uVar11 = 1L << ((byte)uVar8 & 0x3f);
            uVar1 = uVar11 + lVar10;
            uVar2 = 0;
            uVar3 = 0;
            if (uVar1 <= uVar6) {
              lVar10 = uVar1 + uVar11;
              uVar2 = uVar1;
              uVar3 = uVar11;
            }
            lVar9 = lVar9 + uVar3;
            uVar6 = (uVar6 - uVar2) * 2;
          } while (0x30 < uVar8);
          uVar8 = a_00._8_8_ & 0xfffffe0300000000 | (ulong)(uint)(a_00.exp >> 1);
          a_00.exp = (int)uVar8;
          a_00.cls = (char)(uVar8 >> 0x20);
          a_00.sign = (_Bool)(char)(uVar8 >> 0x28);
          a_00._14_2_ = (short)(uVar8 >> 0x30);
          a_00.frac = (ulong)(uVar6 != 0) + lVar9 * 2;
        }
        else if (uVar7 != 3) {
          __assert_fail("a.cls == float_class_normal",
                        "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
                        ,0xc5f,"FloatParts sqrt_float(FloatParts, float_status *, const FloatFmt *)"
                       );
        }
      }
      else {
        status->float_exception_flags = status->float_exception_flags | 1;
        uVar5 = 0x2000000000000000;
        if (status->snan_bit_is_one != '\0') {
          uVar5 = 0x1fffffffffffffff;
        }
        a_00.exp = 0x7fffffff;
        a_00.cls = float_class_qnan;
        a_00.sign = false;
        a_00._14_2_ = 0;
        a_00.frac = uVar5;
      }
    }
  }
  else {
    a_00 = return_nan(a_00,status);
  }
  fVar4 = float16a_round_pack_canonical(a_00,status,&float16_params);
  return fVar4;
}

Assistant:

float16 QEMU_FLATTEN float16_sqrt(float16 a, float_status *status)
{
    FloatParts pa = float16_unpack_canonical(a, status);
    FloatParts pr = sqrt_float(pa, status, &float16_params);
    return float16_round_pack_canonical(pr, status);
}